

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall
slang::SVInt::fromDouble(SVInt *this,bitwidth_t bits,double value,bool isSigned,bool round)

{
  byte bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  ulong value_00;
  uint uVar3;
  SVInt SVar4;
  SVInt result;
  SVInt local_30;
  
  uVar3 = (uint)((ulong)value >> 0x34) & 0x7ff;
  if (uVar3 == 0x3fe && round) {
    SVInt(&result,bits,1,isSigned);
    if ((long)value < 0) {
      operator-(this);
    }
    else {
      SVInt(this,&result.super_SVIntStorage);
    }
  }
  else {
    if (uVar3 < 0x3ff || uVar3 == 0x7ff) {
      SVInt(this,bits,0,isSigned);
      uVar2 = extraout_RDX;
      goto LAB_0025464e;
    }
    value_00 = ((ulong)value & 0xfffffffffffff) + 0x10000000000000;
    if (uVar3 < 0x433) {
      bVar1 = 0x33 - (char)uVar3;
      SVInt(&result,bits,
            (ulong)((~(-1L << (bVar1 & 0x3f)) & value_00) >> (0x32U - (char)uVar3 & 0x3f) != 0 &&
                   round) + (value_00 >> (bVar1 & 0x3f)),isSigned);
      if ((long)value < 0) {
        operator-(this);
      }
      else {
        SVInt(this,&result.super_SVIntStorage);
      }
    }
    else {
      SVInt(&result,bits,value_00,isSigned);
      shl(&local_30,(bitwidth_t)&result);
      operator=(&result,&local_30);
      ~SVInt(&local_30);
      if ((long)value < 0) {
        operator-(this);
      }
      else {
        SVInt(this,&result.super_SVIntStorage);
      }
    }
  }
  ~SVInt(&result);
  uVar2 = extraout_RDX_00;
LAB_0025464e:
  SVar4.super_SVIntStorage.bitWidth = (int)uVar2;
  SVar4.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar2 >> 0x20);
  SVar4.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar2 >> 0x28);
  SVar4.super_SVIntStorage._14_2_ = (short)((ulong)uVar2 >> 0x30);
  SVar4.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar4.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDouble(bitwidth_t bits, double value, bool isSigned, bool round) {
    return fromIEEE754<double, 11, 52, 1023>(bits, value, isSigned, round);
}